

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O0

string * __thiscall
elf_parser::Elf_parser::get_relocation_type_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint64_t *rela_type)

{
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  uint64_t *local_20;
  uint64_t *rela_type_local;
  Elf_parser *this_local;
  
  local_20 = rela_type;
  rela_type_local = (uint64_t *)this;
  this_local = (Elf_parser *)__return_storage_ptr__;
  switch((int)*rela_type) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"R_X86_64_32",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"R_X86_64_PC32",local_35);
    std::allocator<char>::~allocator((allocator<char> *)local_35);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"OTHERS",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"R_X86_64_COPY",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"R_X86_64_GLOB_DAT",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"R_X86_64_JUMP_SLOT",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_relocation_type(uint64_t &rela_type) {
    switch(ELF64_R_TYPE(rela_type)) {
        case 1: return "R_X86_64_32";
        case 2: return "R_X86_64_PC32";
        case 5: return "R_X86_64_COPY";
        case 6: return "R_X86_64_GLOB_DAT";
        case 7:  return "R_X86_64_JUMP_SLOT";
        default: return "OTHERS";
    }
}